

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O3

int __thiscall
QFileDialog::accept(QFileDialog *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  QFileDialogPrivate *this_00;
  QFileDialogLineEdit *pQVar1;
  Data *pDVar2;
  QArrayData *pQVar3;
  char cVar4;
  bool bVar5;
  FileMode mode;
  int iVar6;
  ulong uVar7;
  uint *__addr_len_00;
  QArrayData *__addr_len_01;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *__addr_00;
  sockaddr *extraout_RDX_01;
  sockaddr *extraout_RDX_02;
  sockaddr *psVar8;
  long lVar9;
  QArrayDataPointer<QString> *pQVar10;
  QFileDialogPrivate *pQVar11;
  QFileDialogPrivate *this_01;
  long in_FS_OFFSET;
  QStringView QVar12;
  QLatin1String QVar13;
  QFileInfo info;
  QFileInfo info_1;
  QArrayDataPointer<QString> local_c0;
  QArrayData *local_a8;
  QArrayData *local_a0;
  undefined1 local_98 [16];
  QArrayData *local_88;
  QString local_78;
  QArrayDataPointer<QString> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QFileDialogPrivate **)&(this->super_QDialog).super_QWidget.field_0x8;
  if (((this_00->super_QDialogPrivate).nativeDialogInUse != false) ||
     ((this_00->qFileDialogUi).d == (Ui_QFileDialog *)0x0)) {
    local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    selectedUrls((QList<QUrl> *)&local_58,this);
    if ((undefined1 *)local_58.size != (undefined1 *)0x0) {
      pQVar10 = &local_58;
      QFileDialogPrivate::emitUrlsSelected(this_00,(QList<QUrl> *)pQVar10);
      iVar6 = (int)pQVar10;
      psVar8 = extraout_RDX;
      if ((undefined1 *)local_58.size == (undefined1 *)0x1) {
        pQVar11 = (QFileDialogPrivate *)local_58.ptr;
        QFileDialogPrivate::emitUrlSelected(this_00,(QUrl *)local_58.ptr);
        iVar6 = (int)pQVar11;
        psVar8 = extraout_RDX_00;
      }
      QDialog::accept(&this->super_QDialog,iVar6,psVar8,__addr_len);
    }
    QArrayDataPointer<QUrl>::~QArrayDataPointer((QArrayDataPointer<QUrl> *)&local_58);
    goto LAB_004e7e4b;
  }
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  selectedFiles((QStringList *)&local_58,this);
  if ((undefined1 *)local_58.size == (undefined1 *)0x0) goto LAB_004e7e3e;
  local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QLineEdit::text(&local_78,&((this_00->qFileDialogUi).d)->fileNameEdit->super_QLineEdit);
  if (((undefined1 *)local_78.d.size == (undefined1 *)0x2) &&
     (QVar12.m_data = local_78.d.ptr, QVar12.m_size = 2, QVar13.m_data = "..", QVar13.m_size = 2,
     cVar4 = QtPrivate::equalStrings(QVar12,QVar13), cVar4 != '\0')) {
    QFileDialogPrivate::navigateToParent(this_00);
    pQVar1 = ((this_00->qFileDialogUi).d)->fileNameEdit;
    if (pQVar1 == (QFileDialogLineEdit *)0x0) {
      QLineEdit::selectAll((QLineEdit *)0x0);
    }
    else {
      bVar5 = SUB81(pQVar1,0);
      QObject::blockSignals(bVar5);
      QLineEdit::selectAll(&((this_00->qFileDialogUi).d)->fileNameEdit->super_QLineEdit);
      QObject::blockSignals(bVar5);
    }
    goto switchD_004e7929_default;
  }
  mode = QFileDialogOptions::fileMode();
  __addr_len_00 = &switchD_004e7929::switchdataD_006e51e8;
  switch(mode) {
  case AnyFile:
    local_98._0_8_ = *(undefined8 *)&((QDialogPrivate *)&(local_58.ptr)->d)->super_QWidgetPrivate;
    local_98._8_8_ =
         *(undefined8 *)&(((QDialogPrivate *)&(local_58.ptr)->d)->super_QWidgetPrivate).field_0x8;
    __addr_len_01 =
         *(QArrayData **)&(((QDialogPrivate *)&(local_58.ptr)->d)->super_QWidgetPrivate).field_0x10;
    if ((QArrayData *)local_98._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_98._0_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_98._0_8_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_a0 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    local_88 = __addr_len_01;
    QFileInfo::QFileInfo((QFileInfo *)&local_a0,(QString *)local_98);
    cVar4 = QFileInfo::isDir();
    if (cVar4 == '\0') {
      cVar4 = QFileInfo::exists();
      if (cVar4 == '\0') {
        QFileInfo::path();
        uVar7 = QFileDialogPrivate::maxNameLength((QString *)&local_c0);
        if (&(local_c0.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_c0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_c0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_c0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_c0.d)->super_QArrayData,2,0x10);
          }
        }
        if (-1 < (long)uVar7) {
          QFileInfo::fileName();
          if (&(local_c0.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_c0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_c0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_c0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&(local_c0.d)->super_QArrayData,2,0x10);
            }
          }
          if (uVar7 < (ulong)local_c0.size) goto LAB_004e7d3b;
        }
      }
      cVar4 = QFileInfo::exists();
      if (((cVar4 != '\0') &&
          (cVar4 = QFileDialogOptions::testOption
                             ((FileDialogOption)
                              *(undefined8 *)
                               (*(long *)&(this->super_QDialog).super_QWidget.field_0x8 + 0x3d0)),
          cVar4 == '\0')) && (iVar6 = QFileDialogOptions::acceptMode(), iVar6 != 0)) {
        QFileInfo::fileName();
        bVar5 = QFileDialogPrivate::itemAlreadyExists(this_00,(QString *)&local_c0);
        if (&(local_c0.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_c0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_c0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_c0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_c0.d)->super_QArrayData,2,0x10);
          }
        }
        if (!bVar5) goto LAB_004e7d3b;
      }
      QList<QString>::QList<QString,void>((QList<QString> *)&local_c0,(QString *)local_98);
      pQVar10 = &local_c0;
      QFileDialogPrivate::emitFilesSelected(this_00,(QStringList *)&local_c0);
      iVar6 = (int)pQVar10;
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_c0);
      psVar8 = extraout_RDX_02;
LAB_004e7cee:
      QDialog::accept(&this->super_QDialog,iVar6,psVar8,(socklen_t *)__addr_len_01);
    }
    else {
      QFileInfo::absoluteFilePath();
      setDirectory(this,(QString *)&local_c0);
LAB_004e7d1d:
      if (&(local_c0.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_c0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_c0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_c0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_c0.d)->super_QArrayData,2,0x10);
        }
      }
    }
    goto LAB_004e7d3b;
  case ExistingFile:
  case ExistingFiles:
    if ((undefined1 *)local_58.size != (undefined1 *)0x0) {
      lVar9 = local_58.size * 0x18;
      pQVar11 = (QFileDialogPrivate *)local_58.ptr;
      do {
        local_c0.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        this_01 = pQVar11;
        QFileInfo::QFileInfo((QFileInfo *)&local_c0,(QString *)pQVar11);
        cVar4 = QFileInfo::exists();
        if (cVar4 == '\0') {
          QFileDialogPrivate::getEnvironmentVariable((QString *)local_98,this_01,(QString *)pQVar11)
          ;
          QFileInfo::QFileInfo((QFileInfo *)&local_a0,(QString *)local_98);
          __addr_len_00 = (uint *)local_a0;
          pDVar2 = local_c0.d;
          local_c0.d = (Data *)local_a0;
          local_a0 = &pDVar2->super_QArrayData;
          QFileInfo::~QFileInfo((QFileInfo *)&local_a0);
          if ((QArrayData *)local_98._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_98._0_8_,2,0x10);
            }
          }
        }
        cVar4 = QFileInfo::exists();
        if (cVar4 == '\0') {
          QFileInfo::fileName();
          QFileDialogPrivate::itemNotFound(this_00,(QString *)local_98,mode);
          if ((QArrayData *)local_98._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_98._0_8_,2,0x10);
            }
          }
LAB_004e7e11:
          QFileInfo::~QFileInfo((QFileInfo *)&local_c0);
          goto switchD_004e7929_default;
        }
        cVar4 = QFileInfo::isDir();
        if (cVar4 != '\0') {
          QFileInfo::absoluteFilePath();
          setDirectory(this,(QString *)local_98);
          if ((QArrayData *)local_98._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_98._0_8_,2,0x10);
            }
          }
          QLineEdit::clear(&((this_00->qFileDialogUi).d)->fileNameEdit->super_QLineEdit);
          goto LAB_004e7e11;
        }
        QFileInfo::~QFileInfo((QFileInfo *)&local_c0);
        pQVar11 = (QFileDialogPrivate *)
                  &(pQVar11->super_QDialogPrivate).super_QWidgetPrivate.field_0x18;
        lVar9 = lVar9 + -0x18;
      } while (lVar9 != 0);
    }
    pQVar10 = &local_58;
    QFileDialogPrivate::emitFilesSelected(this_00,(QStringList *)pQVar10);
    QDialog::accept(&this->super_QDialog,(int)pQVar10,__addr_00,__addr_len_00);
    break;
  case Directory:
    local_98._0_8_ = *(undefined8 *)&((QDialogPrivate *)&(local_58.ptr)->d)->super_QWidgetPrivate;
    local_98._8_8_ =
         *(undefined8 *)&(((QDialogPrivate *)&(local_58.ptr)->d)->super_QWidgetPrivate).field_0x8;
    __addr_len_01 =
         *(QArrayData **)&(((QDialogPrivate *)&(local_58.ptr)->d)->super_QWidgetPrivate).field_0x10;
    if ((QArrayData *)local_98._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_98._0_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_98._0_8_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_a0 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar11 = (QFileDialogPrivate *)local_98;
    local_88 = __addr_len_01;
    QFileInfo::QFileInfo((QFileInfo *)&local_a0,(QString *)pQVar11);
    cVar4 = QFileInfo::exists();
    if (cVar4 == '\0') {
      QFileDialogPrivate::getEnvironmentVariable((QString *)&local_c0,pQVar11,(QString *)local_98);
      QFileInfo::QFileInfo((QFileInfo *)&local_a8,(QString *)&local_c0);
      pQVar3 = local_a0;
      __addr_len_01 = local_a8;
      local_a0 = local_a8;
      local_a8 = pQVar3;
      QFileInfo::~QFileInfo((QFileInfo *)&local_a8);
      if (&(local_c0.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_c0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_c0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_c0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_c0.d)->super_QArrayData,2,0x10);
        }
      }
    }
    cVar4 = QFileInfo::exists();
    if (cVar4 == '\0') {
      QFileInfo::fileName();
      QFileDialogPrivate::itemNotFound(this_00,(QString *)&local_c0,Directory);
      goto LAB_004e7d1d;
    }
    cVar4 = QFileInfo::isDir();
    if (cVar4 != '\0') {
      pQVar10 = &local_58;
      QFileDialogPrivate::emitFilesSelected(this_00,(QStringList *)pQVar10);
      iVar6 = (int)pQVar10;
      psVar8 = extraout_RDX_01;
      goto LAB_004e7cee;
    }
LAB_004e7d3b:
    QFileInfo::~QFileInfo((QFileInfo *)&local_a0);
    if ((QArrayData *)local_98._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_98._0_8_,2,0x10);
      }
    }
  }
switchD_004e7929_default:
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
    }
  }
LAB_004e7e3e:
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
LAB_004e7e4b:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (int)*(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void QFileDialog::accept()
{
    Q_D(QFileDialog);
    if (!d->usingWidgets()) {
        const QList<QUrl> urls = selectedUrls();
        if (urls.isEmpty())
            return;
        d->emitUrlsSelected(urls);
        if (urls.size() == 1)
            d->emitUrlSelected(urls.first());
        QDialog::accept();
        return;
    }

    const QStringList files = selectedFiles();
    if (files.isEmpty())
        return;
    QString lineEditText = d->lineEdit()->text();
    // "hidden feature" type .. and then enter, and it will move up a dir
    // special case for ".."
    if (lineEditText == ".."_L1) {
        d->navigateToParent();
        const QSignalBlocker blocker(d->qFileDialogUi->fileNameEdit);
        d->lineEdit()->selectAll();
        return;
    }

    const auto mode = fileMode();
    switch (mode) {
    case Directory: {
        QString fn = files.first();
        QFileInfo info(fn);
        if (!info.exists())
            info = QFileInfo(d->getEnvironmentVariable(fn));
        if (!info.exists()) {
            d->itemNotFound(info.fileName(), mode);
            return;
        }
        if (info.isDir()) {
            d->emitFilesSelected(files);
            QDialog::accept();
        }
        return;
    }

    case AnyFile: {
        QString fn = files.first();
        QFileInfo info(fn);
        if (info.isDir()) {
            setDirectory(info.absoluteFilePath());
            return;
        }

        if (!info.exists()) {
            const long maxNameLength = d->maxNameLength(info.path());
            if (maxNameLength >= 0 && info.fileName().size() > maxNameLength)
                return;
        }

        // check if we have to ask for permission to overwrite the file
        if (!info.exists() || testOption(DontConfirmOverwrite) || acceptMode() == AcceptOpen) {
            d->emitFilesSelected(QStringList(fn));
            QDialog::accept();
        } else {
            if (d->itemAlreadyExists(info.fileName())) {
                d->emitFilesSelected(QStringList(fn));
                QDialog::accept();
            }
        }
        return;
    }

    case ExistingFile:
    case ExistingFiles:
        for (const auto &file : files) {
            QFileInfo info(file);
            if (!info.exists())
                info = QFileInfo(d->getEnvironmentVariable(file));
            if (!info.exists()) {
                d->itemNotFound(info.fileName(), mode);
                return;
            }
            if (info.isDir()) {
                setDirectory(info.absoluteFilePath());
                d->lineEdit()->clear();
                return;
            }
        }
        d->emitFilesSelected(files);
        QDialog::accept();
        return;
    }
}